

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseSos
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  double dVar1;
  size_t sVar2;
  bool bVar3;
  Parsekey PVar4;
  HighsInt HVar5;
  HighsInt id;
  size_t *end_00;
  HMpsFF *pHVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool skip;
  HighsLogOptions *local_110;
  size_t end;
  Parsekey local_fc;
  string colname;
  string word_1;
  bool is_nan;
  undefined6 uStack_b6;
  _Alloc_hider _Stack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  undefined1 local_80 [8];
  string strline;
  size_t begin;
  string word;
  
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  word.field_2._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&this->sos_entries;
  local_80 = (undefined1  [8])&this->sos_type;
  local_88 = &this->sos_name;
  pHVar6 = this;
  local_110 = log_options;
  local_fc = keyword;
  do {
    do {
      bVar3 = getMpsLine(pHVar6,file,&strline,&skip);
      if (!bVar3) goto LAB_00226c89;
    } while (skip != false);
    bVar3 = timeout(this);
    if (bVar3) {
      PVar4 = kTimeout;
      goto LAB_00226cb3;
    }
    word_1._M_dataplus._M_p = (pointer)&word_1.field_2;
    word_1._M_string_length = 0;
    word_1.field_2._M_local_buf[0] = '\0';
    end_00 = &end;
    PVar4 = checkFirstWord(this,&strline,&begin,end_00,&word_1);
    id = (HighsInt)end_00;
    if (PVar4 != kNone) {
      highsLogDev(local_110,kInfo,"readMPS: Read SETS    OK\n");
LAB_00226ca9:
      std::__cxx11::string::~string((string *)&word_1);
      goto LAB_00226cb3;
    }
    bVar3 = std::operator==(&word_1,"S1");
    if ((bVar3) || (bVar3 = std::operator==(&word_1,"S2"), bVar3)) {
      first_word(&colname,&strline,end);
      if (colname._M_string_length == 0) {
        highsLogUser(local_110,kError,"No name given for SOS\n");
        bVar3 = true;
      }
      else {
        _is_nan = (word_1._M_dataplus._M_p[1] != '1') + 1;
        std::vector<short,_std::allocator<short>_>::emplace_back<short>
                  ((vector<short,_std::allocator<short>_> *)local_80,(short *)&is_nan);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_88,&colname);
        _is_nan = (pointer)0x0;
        _Stack_b0._M_p = (pointer)0x0;
        local_a8._M_allocated_capacity = 0;
        std::
        vector<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::allocator<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
        ::emplace_back<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>
                  ((vector<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::allocator<std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
                    *)local_90._M_p,
                   (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &is_nan);
        std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       *)&is_nan);
        bVar3 = false;
      }
      goto LAB_00226c2c;
    }
    if ((this->sos_entries).
        super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->sos_entries).
        super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      trim(&strline,&default_non_chars_abi_cxx11_);
      highsLogUser(local_110,kError,"SOS type specification missing before %s.\n",
                   strline._M_dataplus._M_p);
      PVar4 = kFail;
      goto LAB_00226ca9;
    }
    colname._M_string_length = 0;
    colname._M_dataplus._M_p = (pointer)&colname.field_2;
    colname.field_2._M_local_buf[0] = '\0';
    if (local_fc == kSos) {
      std::__cxx11::string::_M_assign((string *)&colname);
LAB_00226acb:
      HVar5 = getColIdx(this,&colname,true);
      sVar2 = end;
      bVar3 = is_end(&strline,end,&default_non_chars_abi_cxx11_);
      uVar7 = 0;
      uVar8 = 0;
      if (!bVar3) {
        first_word((string *)&is_nan,&strline,sVar2);
        std::__cxx11::string::operator=((string *)&word_1,(string *)&is_nan);
        pHVar6 = (HMpsFF *)&is_nan;
        std::__cxx11::string::~string((string *)&is_nan);
        _is_nan = _is_nan & 0xffffffffffffff00;
        dVar1 = getValue(pHVar6,&word_1,&is_nan,id);
        uVar7 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
        if (is_nan == true) {
          highsLogUser(local_110,kError,"Weight for column \"%s\" is NaN\n",colname._M_dataplus._M_p
                      );
          bVar3 = true;
          goto LAB_00226c2c;
        }
      }
      _is_nan = HVar5;
      _Stack_b0._M_p = (pointer)CONCAT44(uVar8,uVar7);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<std::pair<int,double>>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 ((this->sos_entries).
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1),(pair<int,_double> *)&is_nan);
      bVar3 = false;
    }
    else {
      bVar3 = std::operator!=(&word_1,(this->sos_name).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1);
      sVar2 = end;
      if (bVar3) {
        trim(&word_1,&default_non_chars_abi_cxx11_);
        highsLogUser(local_110,kError,
                     "SOS specification for SOS %s mixed with SOS %s. This is currently not supported.\n"
                     ,(this->sos_name).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,
                     word_1._M_dataplus._M_p);
        bVar3 = true;
      }
      else {
        bVar3 = is_end(&strline,end,&default_non_chars_abi_cxx11_);
        if (!bVar3) {
          first_word((string *)&is_nan,&strline,sVar2);
          std::__cxx11::string::operator=((string *)&colname,(string *)&is_nan);
          std::__cxx11::string::~string((string *)&is_nan);
          end = first_word_end(&strline,sVar2);
          goto LAB_00226acb;
        }
        trim(&strline,&default_non_chars_abi_cxx11_);
        highsLogUser(local_110,kError,"Missing variable in SOS specification line %s.\n",
                     strline._M_dataplus._M_p);
        bVar3 = true;
      }
    }
LAB_00226c2c:
    std::__cxx11::string::~string((string *)&colname);
    pHVar6 = (HMpsFF *)&word_1;
    std::__cxx11::string::~string((string *)pHVar6);
  } while (!bVar3);
LAB_00226c89:
  PVar4 = kFail;
LAB_00226cb3:
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&strline);
  return PVar4;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseSos(const HighsLogOptions& log_options,
                                           std::istream& file,
                                           const HMpsFF::Parsekey keyword) {
  std::string strline, word;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read SETS    OK\n");
      return key;
    }

    if (word == "S1" || word == "S2") {
      /* a new SOS is starting */
      std::string sosname = first_word(strline, end);

      if (sosname.empty()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "No name given for SOS\n");
        return HMpsFF::Parsekey::kFail;
      }

      sos_type.push_back(word[1] == '1' ? 1 : 2);
      sos_name.push_back(sosname);
      sos_entries.push_back(std::vector<std::pair<HighsInt, double> >());
      continue;
    }

    /* a SOS is continuing
     * word is currently the column name and there may be a weight following
     */
    if (sos_entries.empty()) {
      trim(strline);
      highsLogUser(log_options, HighsLogType::kError,
                   "SOS type specification missing before %s.\n",
                   strline.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string colname;

    if (keyword == HMpsFF::Parsekey::kSos) {
      // first word is column index
      colname = word;
    } else {
      // first word is SOS name, second word is colname, third word is weight
      // we expect SOS definitions to be contiguous for now
      if (word != sos_name.back()) {
        trim(word);
        highsLogUser(log_options, HighsLogType::kError,
                     "SOS specification for SOS %s mixed with SOS %s. This is "
                     "currently not supported.\n",
                     sos_name.back().c_str(), word.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (is_end(strline, end)) {
        trim(strline);
        highsLogUser(log_options, HighsLogType::kError,
                     "Missing variable in SOS specification line %s.\n",
                     strline.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      colname = first_word(strline, end);
      end = first_word_end(strline, end);
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    // last word is weight, allow to omit
    double weight = 0.0;
    if (!is_end(strline, end)) {
      word = first_word(strline, end);
      bool is_nan = false;
      weight = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Weight for column \"%s\" is NaN\n", colname.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }

    sos_entries.back().push_back(std::make_pair(colidx, weight));
  }

  return HMpsFF::Parsekey::kFail;
}